

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall
obs::safe_list<obs::slot<void_(int)>_>::erase
          (safe_list<obs::slot<void_(int)>_> *this,slot<void_(int)> *value)

{
  anon_class_8_1_898f5b00 __p;
  node **ppnVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  ref(this);
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->m_mutex_nodes);
  ppnVar1 = &this->m_first;
  do {
    __p.node = *ppnVar1;
    if (__p.node == (node *)0x0) {
LAB_00102a4c:
      std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
      unref(this);
      return;
    }
    if ((__p.node)->value == value) {
      if (value == (slot<void_(int)> *)0x0) {
        __assert_fail("node->value",
                      "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                      ,0x138,
                      "void obs::safe_list<obs::slot<void (int)>>::erase(T *) [T = obs::slot<void (int)>]"
                     );
      }
      node::unlock_all(__p.node);
      (__p.node)->value = (slot<void_(int)> *)0x0;
      this->m_delete_nodes = true;
      if ((__p.node)->locks != 0) {
        std::condition_variable::
        wait<obs::safe_list<obs::slot<void(int)>>::erase(obs::slot<void(int)>*)::_lambda()_1_>
                  (&this->m_delete_cv,&uStack_28,__p);
        if ((__p.node)->locks != 0) {
          __assert_fail("node->locks == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                        ,0x146,
                        "void obs::safe_list<obs::slot<void (int)>>::erase(T *) [T = obs::slot<void (int)>]"
                       );
        }
      }
      goto LAB_00102a4c;
    }
    ppnVar1 = &(__p.node)->next;
  } while( true );
}

Assistant:

void erase(T* value) {
    // We add a ref to avoid calling delete_nodes().
    ref();
    {
      std::unique_lock<std::mutex> lock(m_mutex_nodes);

      for (node* node=m_first; node; node=node->next) {
        if (node->value == value) {
          // We disable the node so it isn't used anymore by other
          // iterators.
          assert(node->value);
          node->unlock_all();
          node->value = nullptr;
          m_delete_nodes = true;

          // In this case we should wait until the node is unlocked,
          // because after erase() the client could be deleting the
          // value that we are using in other thread.
          if (node->locks) {
            // Wait until the node is completely unlocked by other
            // threads.
            m_delete_cv.wait(lock, [node]{ return node->locks == 0; });
          }

          assert(node->locks == 0);

          // The node will be finally deleted when we leave the
          // iteration loop (m_ref==0, i.e. the end() iterator is
          // destroyed)
          break;
        }
      }
    }
    unref();
  }